

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<MaterialDataV>::~TPZVec(TPZVec<MaterialDataV> *this)

{
  MaterialDataV *pMVar1;
  double dVar2;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01816100;
  pMVar1 = this->fStore;
  if (pMVar1 != (MaterialDataV *)0x0) {
    dVar2 = pMVar1[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
    if (dVar2 != 0.0) {
      lVar3 = (long)dVar2 * 0x98;
      do {
        MaterialDataV::~MaterialDataV
                  ((MaterialDataV *)
                   ((long)pMVar1[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc +
                   lVar3 + -0x48));
        lVar3 = lVar3 + -0x98;
      } while (lVar3 != 0);
    }
    operator_delete__(pMVar1[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                      (long)dVar2 * 0x98 + 8);
    return;
  }
  return;
}

Assistant:

inline TPZVec<T>::~TPZVec() {
	if( fStore )
	{
		delete [] fStore;
	}
}